

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O1

void __thiscall
GrcManager::WalkFeatureSettingsTree
          (GrcManager *this,RefAST *ast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vsta)

{
  int munitPR;
  pointer pbVar1;
  GrcSymbolTable *this_00;
  GrcMasterTable *this_01;
  pointer pGVar2;
  string staDescription;
  int iVar3;
  Symbol pGVar4;
  RefAST *pRVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  undefined8 uStack_128;
  RefAST astT;
  _Alloc_hider local_118;
  undefined1 local_110 [24];
  RefAST astNextID;
  RefAST astValue;
  GdlSlotRefExpression *local_d0;
  RefCount<AST> local_c8;
  RefAST local_c0;
  RefAST local_b8;
  RefAST local_b0;
  RefAST local_a8;
  RefAST local_a0;
  Symbol local_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  AST::getFirstChild(ast->ref->ptr);
  AST::getText_abi_cxx11_((string *)&astT,(astNextID.ref)->ptr);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)vsta,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&astT);
  if (astT.ref != (Ref *)local_110) {
    operator_delete(astT.ref,local_110._0_8_ + 1);
  }
  iVar3 = AST::getType(ast->ref->ptr);
  if (iVar3 == 4) {
    if (0x20 < (ulong)((long)(vsta->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vsta->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      this_00 = this->m_psymtbl;
      GrcStructName::GrcStructName((GrcStructName *)&astValue,vsta);
      local_a8 = (RefAST)ast->ref;
      if (local_a8.ref == (Ref *)0x0) {
        local_a8.ref = (Ref *)0x0;
      }
      else {
        (local_a8.ref)->count = (local_a8.ref)->count + 1;
      }
      LineAndFile((GrpLineAndFile *)&astT,this,&local_a8);
      pGVar4 = GrcSymbolTable::AddSymbol
                         (this_00,(GrcStructName *)&astValue,ksymtFeatSetting,
                          (GrpLineAndFile *)&astT);
      if (local_118._M_p != local_110 + 8) {
        operator_delete(local_118._M_p,local_110._8_8_ + 1);
      }
      RefCount<AST>::~RefCount(&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&astValue);
      AST::getNextSibling((astNextID.ref)->ptr);
      if ((astValue.ref == (Ref *)0x0) || ((astValue.ref)->ptr == (AST *)0x0)) {
        RefCount<AST>::~RefCount(&astValue);
        goto LAB_001d644c;
      }
      iVar3 = AST::getType((astValue.ref)->ptr);
      local_98 = pGVar4;
      if (iVar3 == 0xd) {
        local_d0 = (GdlSlotRefExpression *)operator_new(0x60);
        AST::getText_abi_cxx11_(&local_50,(astValue.ref)->ptr);
        GdlSlotRefExpression::GdlSlotRefExpression(local_d0,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_b0 = (RefAST)ast->ref;
        if (local_b0.ref == (Ref *)0x0) {
          local_b0.ref = (Ref *)0x0;
        }
        else {
          (local_b0.ref)->count = (local_b0.ref)->count + 1;
        }
        LineAndFile((GrpLineAndFile *)&astT,this,&local_b0);
        *(Ref **)&local_d0->field_0x8 = astT.ref;
        std::__cxx11::string::_M_assign((string *)&local_d0->field_0x10);
        if (local_118._M_p != local_110 + 8) {
          operator_delete(local_118._M_p,local_110._8_8_ + 1);
        }
        pRVar5 = &local_b0;
      }
      else {
        if (astValue.ref == (Ref *)0x0) {
          astValue.ref = (Ref *)0x0;
        }
        else {
          (astValue.ref)->count = (astValue.ref)->count + 1;
        }
        local_b8.ref = astValue.ref;
        local_d0 = (GdlSlotRefExpression *)WalkExpressionTree(this,&local_b8);
        pRVar5 = &local_b8;
      }
      RefCount<AST>::~RefCount(pRVar5);
      this_01 = this->m_mtbFeatures;
      pGVar2 = (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar3 = pGVar2[-1].m_nPointRadius;
      munitPR = pGVar2[-1].m_mPrUnits;
      bVar7 = pGVar2[-1].m_fAttrOverride;
      local_c0 = (RefAST)ast->ref;
      if (local_c0.ref == (Ref *)0x0) {
        local_c0.ref = (Ref *)0x0;
      }
      else {
        (local_c0.ref)->count = (local_c0.ref)->count + 1;
      }
      LineAndFile((GrpLineAndFile *)&astT,this,&local_c0);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"feature setting","");
      staDescription._M_string_length = uStack_128;
      staDescription._M_dataplus._M_p = (pointer)local_90;
      staDescription.field_2._M_allocated_capacity = (size_type)astT.ref;
      staDescription.field_2._8_8_ = local_118._M_p;
      GrcMasterTable::AddItem
                (this_01,local_98,(GdlExpression *)local_d0,iVar3,munitPR,bVar7,
                 (GrpLineAndFile *)&astT,staDescription);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if (local_118._M_p != local_110 + 8) {
        operator_delete(local_118._M_p,local_110._8_8_ + 1);
      }
      RefCount<AST>::~RefCount(&local_c0);
      pRVar5 = &astValue;
      goto LAB_001d6267;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Invalid feature statement","");
    local_a0 = (RefAST)ast->ref;
    if (local_a0.ref == (Ref *)0x0) {
      local_a0.ref = (Ref *)0x0;
    }
    else {
      (local_a0.ref)->count = (local_a0.ref)->count + 1;
    }
    LineAndFile((GrpLineAndFile *)&astT,this,&local_a0);
    GrcErrorList::AddError(&g_errorList,0x47d,(GdlObject *)0x0,&local_70,(GrpLineAndFile *)&astT);
    if (local_118._M_p != local_110 + 8) {
      operator_delete(local_118._M_p,local_110._8_8_ + 1);
    }
    RefCount<AST>::~RefCount(&local_a0);
    _Var6._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001d644c;
  }
  else {
    AST::getNextSibling((astNextID.ref)->ptr);
    bVar7 = astT.ref == (Ref *)0x0;
    if (!bVar7) {
      do {
        if ((astT.ref)->ptr == (AST *)0x0) break;
        if (bVar7) {
          local_c8.ref = (Ref *)0x0;
        }
        else {
          (astT.ref)->count = (astT.ref)->count + 1;
          local_c8.ref = astT.ref;
        }
        WalkFeatureSettingsTree(this,&local_c8,vsta);
        RefCount<AST>::~RefCount(&local_c8);
        AST::getNextSibling((astT.ref)->ptr);
        RefCount<AST>::operator=(&astT,&astValue);
        RefCount<AST>::~RefCount(&astValue);
        bVar7 = astT.ref == (Ref *)0x0;
      } while (!bVar7);
    }
    pRVar5 = &astT;
LAB_001d6267:
    RefCount<AST>::~RefCount(pRVar5);
    pbVar1 = (vsta->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (vsta->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    _Var6._M_p = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p == &pbVar1[-1].field_2) goto LAB_001d644c;
    local_70.field_2._M_allocated_capacity = pbVar1[-1].field_2._M_allocated_capacity;
  }
  operator_delete(_Var6._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_001d644c:
  RefCount<AST>::~RefCount(&astNextID);
  return;
}

Assistant:

void GrcManager::WalkFeatureSettingsTree(RefAST ast, std::vector<std::string> & vsta)
{
	RefAST astNextID = ast->getFirstChild();
	vsta.push_back(astNextID->getText());

	if (ast->getType() == OP_EQ)
	{
		if (vsta.size() < 2)
		{
			g_errorList.AddError(1149, NULL,
				"Invalid feature statement",
				LineAndFile(ast));
			return;
		}

		Symbol psym = SymbolTable()->AddSymbol(GrcStructName(vsta), ksymtFeatSetting,
			LineAndFile(ast));

		RefAST astValue = astNextID->getNextSibling();
		if (!astValue)
			return;

		GdlExpression *pexpValue;
		if (astValue->getType() == IDENT)
		{
			//	A kludge, because this isn't a slot-ref expression, but that is the
			//	most convenient thing to hold a simple identifier until we can process it
			//	further (see the master table function that processes the features).
			pexpValue = new GdlSlotRefExpression(astValue->getText());
			pexpValue->SetLineAndFile(LineAndFile(ast));
		}
		else
		{
			pexpValue = WalkExpressionTree(astValue);
		}
		m_mtbFeatures->AddItem(psym, pexpValue,
			PointRadius(), PointRadiusUnits(), AttrOverride(), LineAndFile(ast),
			"feature setting");
	}
	else
	{
		Assert(ast->getType() == OP_DOT || ast->getType() == ZdotStruct);
		RefAST astT = astNextID->getNextSibling();
		while (astT)
		{
			WalkFeatureSettingsTree(astT, vsta);
			astT = astT->getNextSibling();
		}
	}

	vsta.pop_back();
}